

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIScrollBar * __thiscall
irr::gui::CGUIEnvironment::addScrollBar
          (CGUIEnvironment *this,bool horizontal,rect<int> *rectangle,IGUIElement *parent,s32 id)

{
  CGUIScrollBar *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUIScrollBar *)operator_new(0x1a0);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUIScrollBar::CGUIScrollBar
            (this_00,horizontal,&this->super_IGUIEnvironment,parent_00,id,*rectangle,false);
  IReferenceCounted::drop
            ((IReferenceCounted *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x18)));
  return (IGUIScrollBar *)this_00;
}

Assistant:

IGUIScrollBar *CGUIEnvironment::addScrollBar(bool horizontal, const core::rect<s32> &rectangle, IGUIElement *parent, s32 id)
{
	IGUIScrollBar *bar = new CGUIScrollBar(horizontal, this, parent ? parent : this, id, rectangle);
	bar->drop();
	return bar;
}